

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_freeaddrinfo.c
# Opt level: O0

void ares_freeaddrinfo_cnames(ares_addrinfo_cname *head)

{
  ares_addrinfo_cname *paVar1;
  ares_addrinfo_cname *current;
  ares_addrinfo_cname *head_local;
  
  current = head;
  while (current != (ares_addrinfo_cname *)0x0) {
    paVar1 = current->next;
    ares_free(current->alias);
    ares_free(current->name);
    ares_free(current);
    current = paVar1;
  }
  return;
}

Assistant:

void ares_freeaddrinfo_cnames(struct ares_addrinfo_cname *head)
{
  struct ares_addrinfo_cname *current;
  while (head) {
    current = head;
    head    = head->next;
    ares_free(current->alias);
    ares_free(current->name);
    ares_free(current);
  }
}